

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void V_DrawViewBorder(void)

{
  int iVar1;
  int iVar2;
  int x2;
  
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  if (0x140 < iVar1) {
    ST_SetNeedRefresh();
  }
  iVar1 = viewwidth;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  if (iVar1 != iVar2) {
    iVar1 = DCanvas::GetWidth((DCanvas *)screen);
    V_DrawBorder(0,0,iVar1,viewwindowy);
    V_DrawBorder(0,viewwindowy,viewwindowx,viewheight + viewwindowy);
    iVar1 = viewwindowy;
    iVar2 = viewwindowx + viewwidth;
    x2 = DCanvas::GetWidth((DCanvas *)screen);
    V_DrawBorder(iVar2,iVar1,x2,viewheight + viewwindowy);
    iVar1 = viewwindowy + viewheight;
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    V_DrawBorder(0,iVar1,iVar2,ST_Y);
    V_DrawFrame(viewwindowx,viewwindowy,viewwidth,viewheight);
    iVar1 = DCanvas::GetWidth((DCanvas *)screen);
    V_MarkRect(0,0,iVar1,ST_Y);
  }
  return;
}

Assistant:

static void V_DrawViewBorder (void)
{
	// [RH] Redraw the status bar if SCREENWIDTH > status bar width.
	// Will draw borders around itself, too.
	if (SCREENWIDTH > 320)
	{
		ST_SetNeedRefresh();
	}

	if (viewwidth == SCREENWIDTH)
	{
		return;
	}

	V_DrawBorder (0, 0, SCREENWIDTH, viewwindowy);
	V_DrawBorder (0, viewwindowy, viewwindowx, viewheight + viewwindowy);
	V_DrawBorder (viewwindowx + viewwidth, viewwindowy, SCREENWIDTH, viewheight + viewwindowy);
	V_DrawBorder (0, viewwindowy + viewheight, SCREENWIDTH, ST_Y);

	V_DrawFrame (viewwindowx, viewwindowy, viewwidth, viewheight);
	V_MarkRect (0, 0, SCREENWIDTH, ST_Y);
}